

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

void duckdb::Catalog::AutoloadExtensionByConfigName
               (ClientContext *context,string *configuration_name)

{
  bool bVar1;
  DBConfig *pDVar2;
  CatalogException *__return_storage_ptr__;
  ExtensionEntry (*in_RCX) [62];
  string extension_name;
  string local_40;
  
  pDVar2 = DBConfig::GetConfig(context);
  if ((pDVar2->options).autoload_known_extensions == true) {
    ExtensionHelper::FindExtensionInEntries<62ul>
              (&local_40,(ExtensionHelper *)configuration_name,(string *)"azure_account_name",in_RCX
              );
    bVar1 = ExtensionHelper::CanAutoloadExtension(&local_40);
    if (bVar1) {
      ExtensionHelper::AutoLoadExtension(context,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      if (bVar1) {
        return;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  __return_storage_ptr__ = (CatalogException *)__cxa_allocate_exception(0x10);
  UnrecognizedConfigurationError(__return_storage_ptr__,context,configuration_name);
  __cxa_throw(__return_storage_ptr__,&CatalogException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

void Catalog::AutoloadExtensionByConfigName(ClientContext &context, const string &configuration_name) {
#ifndef DUCKDB_DISABLE_EXTENSION_LOAD
	auto &dbconfig = DBConfig::GetConfig(context);
	if (dbconfig.options.autoload_known_extensions) {
		auto extension_name = ExtensionHelper::FindExtensionInEntries(configuration_name, EXTENSION_SETTINGS);
		if (ExtensionHelper::CanAutoloadExtension(extension_name)) {
			ExtensionHelper::AutoLoadExtension(context, extension_name);
			return;
		}
	}
#endif

	throw Catalog::UnrecognizedConfigurationError(context, configuration_name);
}